

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint _h;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float *pfVar9;
  uint uVar10;
  int i;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  int iVar17;
  void *pvVar18;
  int p;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar11 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar11;
  }
  iVar11 = this->num_output;
  uVar2 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar21 = (ulong)_h;
  uVar3 = bottom_blob->c;
  if ((bottom_blob->dims == 2) && (uVar2 == this->weight_data_size / iVar11)) {
    Mat::create(top_blob,iVar11,_h,bottom_blob->elemsize,opt->blob_allocator);
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar11 = top_blob->w;
    sVar7 = top_blob->elemsize;
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar16 = (ulong)uVar2;
    }
    uVar3 = this->num_output;
    if (this->num_output < 1) {
      uVar3 = 0;
    }
    pvVar20 = bottom_blob->data;
    if ((int)_h < 1) {
      uVar21 = 0;
    }
    iVar4 = bottom_blob->w;
    sVar8 = bottom_blob->elemsize;
    for (uVar14 = 0; uVar14 != uVar21; uVar14 = uVar14 + 1) {
      pvVar18 = (this->weight_data).data;
      iVar17 = this->bias_term;
      iVar5 = this->activation_type;
      pvVar15 = (this->bias_data).data;
      pfVar9 = (float *)(this->activation_params).data;
      for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
        if (iVar17 == 0) {
          fVar24 = 0.0;
        }
        else {
          fVar24 = *(float *)((long)pvVar15 + uVar19 * 4);
        }
        for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
          fVar24 = fVar24 + *(float *)((long)pvVar18 + uVar13 * 4) *
                            *(float *)((long)pvVar20 + uVar13 * 4);
        }
        fVar22 = fVar24;
        switch(iVar5) {
        case 1:
          if (fVar24 <= 0.0) {
            fVar22 = 0.0;
          }
          break;
        case 2:
          fVar22 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar9 |
                          -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
          break;
        case 3:
          if (fVar24 <= *pfVar9) {
            fVar24 = *pfVar9;
          }
          fVar22 = pfVar9[1];
          if (fVar24 <= pfVar9[1]) {
            fVar22 = fVar24;
          }
          break;
        case 4:
          if (88.37626 <= fVar24) {
            fVar24 = 88.37626;
          }
          fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar24 < -88.37626) & (uint)-fVar24));
          fVar22 = 1.0 / (fVar24 + 1.0);
          break;
        case 5:
          fVar22 = expf(fVar24);
          fVar22 = logf(fVar22 + 1.0);
          fVar22 = tanhf(fVar22);
          fVar22 = fVar22 * fVar24;
          break;
        case 6:
          fVar1 = *pfVar9;
          fVar23 = -pfVar9[1] / fVar1;
          fVar22 = 0.0;
          if ((fVar23 <= fVar24) && (fVar22 = fVar24, fVar24 <= fVar23 + 1.0 / fVar1)) {
            fVar22 = (fVar1 * fVar24 + pfVar9[1]) * fVar24;
          }
        }
        *(float *)((long)pvVar6 + uVar19 * 4 + (long)iVar11 * sVar7 * uVar14) = fVar22;
        pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar2 * 4);
      }
      pvVar20 = (void *)((long)pvVar20 + (long)iVar4 * sVar8);
    }
  }
  else {
    Mat::create(top_blob,iVar11,bottom_blob->elemsize,opt->blob_allocator);
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar12 = _h * uVar2;
    iVar11 = this->bias_term;
    pvVar20 = (this->bias_data).data;
    iVar4 = this->activation_type;
    pfVar9 = (float *)(this->activation_params).data;
    uVar21 = 0;
    if (0 < (int)uVar12) {
      uVar21 = (ulong)uVar12;
    }
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    uVar10 = this->num_output;
    if (this->num_output < 1) {
      uVar10 = 0;
    }
    iVar17 = 0;
    for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
      if (iVar11 == 0) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = *(float *)((long)pvVar20 + uVar14 * 4);
      }
      pvVar18 = bottom_blob->data;
      pvVar15 = (void *)((long)iVar17 * 4 + (long)(this->weight_data).data);
      for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
        for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
          fVar24 = fVar24 + *(float *)((long)pvVar15 + uVar13 * 4) *
                            *(float *)((long)pvVar18 + uVar13 * 4);
        }
        pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar12 * 4);
        pvVar18 = (void *)((long)pvVar18 + bottom_blob->cstep * bottom_blob->elemsize);
      }
      fVar22 = fVar24;
      switch(iVar4) {
      case 1:
        if (fVar24 <= 0.0) {
          fVar22 = 0.0;
        }
        break;
      case 2:
        fVar22 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar9 | -(uint)(0.0 < fVar24) & 0x3f800000
                        ) * fVar24;
        break;
      case 3:
        if (fVar24 <= *pfVar9) {
          fVar24 = *pfVar9;
        }
        fVar22 = pfVar9[1];
        if (fVar24 <= pfVar9[1]) {
          fVar22 = fVar24;
        }
        break;
      case 4:
        if (88.37626 <= fVar24) {
          fVar24 = 88.37626;
        }
        fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                             ~-(uint)(fVar24 < -88.37626) & (uint)-fVar24));
        fVar22 = 1.0 / (fVar24 + 1.0);
        break;
      case 5:
        fVar22 = expf(fVar24);
        fVar22 = logf(fVar22 + 1.0);
        fVar22 = tanhf(fVar22);
        fVar22 = fVar22 * fVar24;
        break;
      case 6:
        fVar1 = *pfVar9;
        fVar23 = -pfVar9[1] / fVar1;
        fVar22 = 0.0;
        if ((fVar23 <= fVar24) && (fVar22 = fVar24, fVar24 <= fVar23 + 1.0 / fVar1)) {
          fVar22 = (fVar1 * fVar24 + pfVar9[1]) * fVar24;
        }
      }
      *(float *)((long)pvVar6 + uVar14 * 4) = fVar22;
      iVar17 = iVar17 + _h * uVar2 * uVar3;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}